

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

void ncnn::resize_bilinear_image(Mat *src,Mat *dst,int w,int h)

{
  size_t __size;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  long lVar8;
  int *piVar9;
  void *pvVar10;
  undefined8 *puVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  float *rows1p;
  ulong uVar16;
  void *pvVar17;
  ulong uVar18;
  ulong uVar19;
  float *rows0p;
  ulong uVar20;
  ulong uVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  ulong local_a0;
  ulong local_98;
  int *local_60;
  
  iVar6 = src->w;
  iVar3 = src->h;
  iVar5 = h * 3 + w * 3;
  uVar18 = 0xffffffffffffffff;
  if (-1 < iVar5) {
    uVar18 = (long)iVar5 * 4;
  }
  pvVar7 = operator_new__(uVar18);
  lVar12 = (long)w;
  lVar8 = (long)h;
  uVar18 = (ulong)(uint)w;
  if (0 < w) {
    lVar14 = lVar8 * 4 + lVar12 * 4;
    uVar16 = 0;
    do {
      fVar24 = ((float)(int)uVar16 + 0.5) * (float)iVar6 * (1.0 / (float)w) + -0.5;
      fVar23 = floorf(fVar24);
      iVar5 = (int)fVar23;
      fVar25 = 0.0;
      bVar22 = -1 < iVar5;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      if (bVar22) {
        fVar25 = fVar24 - (float)(int)fVar23;
      }
      if (iVar6 + -1 <= iVar5) {
        fVar25 = 1.0;
        iVar5 = iVar6 + -2;
      }
      *(int *)((long)pvVar7 + uVar16 * 4) = iVar5;
      *(float *)((long)pvVar7 + uVar16 * 8 + lVar14) = 1.0 - fVar25;
      *(float *)((long)pvVar7 + uVar16 * 8 + lVar14 + 4) = fVar25;
      uVar16 = uVar16 + 1;
    } while (uVar18 != uVar16);
  }
  if (0 < h) {
    lVar14 = (long)(w * 2) * 4 + lVar8 * 4 + lVar12 * 4;
    uVar16 = 0;
    do {
      fVar24 = ((float)(int)uVar16 + 0.5) * (float)iVar3 * (1.0 / (float)h) + -0.5;
      fVar23 = floorf(fVar24);
      iVar6 = (int)fVar23;
      fVar25 = 0.0;
      bVar22 = -1 < iVar6;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      if (bVar22) {
        fVar25 = fVar24 - (float)(int)fVar23;
      }
      if (iVar3 + -1 <= iVar6) {
        fVar25 = 1.0;
        iVar6 = iVar3 + -2;
      }
      *(int *)((long)pvVar7 + uVar16 * 4 + lVar12 * 4) = iVar6;
      *(float *)((long)pvVar7 + uVar16 * 8 + lVar14) = 1.0 - fVar25;
      *(float *)((long)pvVar7 + uVar16 * 8 + lVar14 + 4) = fVar25;
      uVar16 = uVar16 + 1;
    } while ((uint)h != uVar16);
  }
  if (w + 1 == 0) {
    local_60 = (int *)0x0;
    local_98 = 0;
    piVar9 = (int *)0x0;
    local_a0 = 0;
  }
  else {
    lVar14 = (long)(w + 1);
    __size = lVar14 * 4 + 0x1c;
    pvVar10 = malloc(__size);
    local_98 = (long)pvVar10 + 0x17U & 0xfffffffffffffff0;
    *(void **)(local_98 - 8) = pvVar10;
    local_60 = (int *)(local_98 + lVar14 * 4);
    *local_60 = 1;
    pvVar10 = malloc(__size);
    local_a0 = (long)pvVar10 + 0x17U & 0xfffffffffffffff0;
    *(void **)(local_a0 - 8) = pvVar10;
    piVar9 = (int *)(local_a0 + lVar14 * 4);
    *piVar9 = 1;
  }
  if (0 < h) {
    puVar11 = (undefined8 *)((long)pvVar7 + (long)(w * 2) * 4 + lVar8 * 4 + lVar12 * 4);
    pvVar10 = src->data;
    iVar6 = src->w;
    pvVar17 = dst->data;
    iVar3 = dst->w;
    lVar8 = lVar8 * 4 + lVar12 * 4;
    iVar5 = -1;
    uVar19 = 0;
    uVar16 = local_a0;
    uVar20 = local_98;
    do {
      iVar4 = *(int *)((long)pvVar7 + uVar19 * 4 + lVar12 * 4);
      if (iVar4 == iVar5) {
        uVar15 = uVar20;
        uVar21 = uVar16;
        if (0 < w) {
          uVar16 = 0;
          do {
            uVar1 = *(undefined8 *)((long)pvVar7 + uVar16 * 8 + lVar8);
            uVar2 = *(undefined8 *)
                     ((long)pvVar10 +
                     (long)*(int *)((long)pvVar7 + uVar16 * 4) * 4 + (long)((iVar4 + 1) * iVar6) * 4
                     );
            *(float *)(uVar20 + uVar16 * 4) =
                 (float)((ulong)uVar2 >> 0x20) * (float)((ulong)uVar1 >> 0x20) +
                 (float)uVar2 * (float)uVar1;
            uVar16 = uVar16 + 1;
          } while (uVar18 != uVar16);
        }
      }
      else {
        uVar15 = uVar16;
        uVar21 = uVar20;
        if (0 < w) {
          uVar13 = 0;
          do {
            lVar14 = (long)*(int *)((long)pvVar7 + uVar13 * 4);
            uVar1 = *(undefined8 *)((long)pvVar7 + uVar13 * 8 + lVar8);
            uVar2 = *(undefined8 *)((long)pvVar10 + lVar14 * 4 + (long)(iVar6 * iVar4) * 4);
            fVar24 = (float)uVar1;
            fVar23 = (float)((ulong)uVar1 >> 0x20);
            *(float *)(uVar20 + uVar13 * 4) =
                 (float)((ulong)uVar2 >> 0x20) * fVar23 + (float)uVar2 * fVar24;
            uVar1 = *(undefined8 *)((long)pvVar10 + lVar14 * 4 + (long)((iVar4 + 1) * iVar6) * 4);
            *(float *)(uVar16 + uVar13 * 4) =
                 (float)((ulong)uVar1 >> 0x20) * fVar23 + (float)uVar1 * fVar24;
            uVar13 = uVar13 + 1;
          } while (uVar18 != uVar13);
        }
      }
      if (w != 0) {
        uVar1 = *puVar11;
        lVar14 = 0;
        do {
          *(float *)((long)pvVar17 + lVar14 * 4) =
               *(float *)(uVar15 + lVar14 * 4) * (float)((ulong)uVar1 >> 0x20) +
               *(float *)(uVar21 + lVar14 * 4) * (float)uVar1;
          lVar14 = lVar14 + 1;
        } while (w != (int)lVar14);
      }
      iVar5 = iVar4 + 1;
      puVar11 = puVar11 + 1;
      uVar19 = uVar19 + 1;
      pvVar17 = (void *)((long)pvVar17 + (long)iVar3 * 4);
      uVar16 = uVar15;
      uVar20 = uVar21;
    } while (uVar19 != (uint)h);
  }
  operator_delete__(pvVar7);
  if (piVar9 != (int *)0x0) {
    LOCK();
    iVar6 = *piVar9;
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if ((local_a0 != 0) && (iVar6 == 1)) {
      free(*(void **)(local_a0 - 8));
    }
  }
  if (local_60 != (int *)0x0) {
    LOCK();
    *local_60 = *local_60 + -1;
    UNLOCK();
    if (local_98 != 0 && *local_60 == 0) {
      free(*(void **)(local_98 - 8));
      return;
    }
  }
  return;
}

Assistant:

static void resize_bilinear_image(const Mat& src, Mat& dst, int w, int h)
{
    double scale_x = (double)src.w / w;
    double scale_y = (double)src.h / h;

    int* buf = new int[w + h + w*2 + h*2];

    int* xofs = buf;//new int[w];
    int* yofs = buf + w;//new int[h];

    float* alpha = (float*)(buf + w + h);//new float[w * 2];
    float* beta = (float*)(buf + w + h + w*2);//new float[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale_x - 0.5);
        sx = floor(fx);
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= src.w - 1)
        {
            sx = src.w - 2;
            fx = 1.f;
        }

        xofs[dx] = sx;

        alpha[dx*2    ] = 1.f - fx;
        alpha[dx*2 + 1] = fx;
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale_y - 0.5);
        sy = floor(fy);
        fy -= sy;

        if (sy < 0)
        {
            sy = 0;
            fy = 0.f;
        }
        if (sy >= src.h - 1)
        {
            sy = src.h - 2;
            fy = 1.f;
        }

        yofs[dy] = sy;

        beta[dy*2    ] = 1.f - fy;
        beta[dy*2 + 1] = fy;
    }

    // loop body
    Mat rowsbuf0(w + 1);
    Mat rowsbuf1(w + 1);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;

    int prev_sy1 = -1;

    for (int dy = 0; dy < h; dy++ )
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const float* S1 = src.row(sy+1);

            const float* alphap = alpha;
            float* rows1p = rows1;
            int dx = 0;
#if __ARM_NEON
            for ( ; dx+1 < w; dx += 2 )
            {
                int sx = xofs[dx];
                int sxn = xofs[dx+1];
                const float* S1p = S1 + sx;
                const float* S1np = S1 + sxn;

                float32x4_t _a = vld1q_f32(alphap);
                float32x2_t _S1 = vld1_f32(S1p);
                float32x2_t _S1n = vld1_f32(S1np);

                float32x4_t _S1S1n = vcombine_f32(_S1, _S1n);
                float32x4_t _ms1 = vmulq_f32(_S1S1n, _a);
                float32x2_t _rows1 = vpadd_f32(vget_low_f32(_ms1), vget_high_f32(_ms1));

                vst1_f32(rows1p + dx, _rows1);

                alphap += 4;
            }
#endif // __ARM_NEON
            for ( ; dx < w; dx++ )
            {
                int sx = xofs[dx];
                const float* S1p = S1 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                rows1p[dx] = S1p[0]*a0 + S1p[1]*a1;

                alphap += 2;
            }
        }
        else
        {
            // hresize two rows
            const float* S0 = src.row(sy);
            const float* S1 = src.row(sy+1);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            int dx = 0;
#if __ARM_NEON
            for ( ; dx+1 < w; dx += 2 )
            {
                int sx = xofs[dx];
                int sxn = xofs[dx+1];
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;
                const float* S0np = S0 + sxn;
                const float* S1np = S1 + sxn;

                float32x4_t _a = vld1q_f32(alphap);
                float32x2_t _S0 = vld1_f32(S0p);
                float32x2_t _S1 = vld1_f32(S1p);
                float32x2_t _S0n = vld1_f32(S0np);
                float32x2_t _S1n = vld1_f32(S1np);

                float32x4_t _S0S0n = vcombine_f32(_S0, _S0n);
                float32x4_t _S1S1n = vcombine_f32(_S1, _S1n);
                float32x4_t _ms0 = vmulq_f32(_S0S0n, _a);
                float32x4_t _ms1 = vmulq_f32(_S1S1n, _a);
                float32x2_t _rows0 = vpadd_f32(vget_low_f32(_ms0), vget_high_f32(_ms0));
                float32x2_t _rows1 = vpadd_f32(vget_low_f32(_ms1), vget_high_f32(_ms1));

                vst1_f32(rows0p + dx, _rows0);
                vst1_f32(rows1p + dx, _rows1);

                alphap += 4;
            }
#endif // __ARM_NEON
            for ( ; dx < w; dx++ )
            {
                int sx = xofs[dx];
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                rows0p[dx] = S0p[0]*a0 + S0p[1]*a1;
                rows1p[dx] = S1p[0]*a0 + S1p[1]*a1;

                alphap += 2;
            }
        }

        prev_sy1 = sy + 1;

        // vresize
        float b0 = beta[0];
        float b1 = beta[1];

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* Dp = dst.row(dy);

#if __ARM_NEON
        int nn = w >> 3;
#else
        int nn = 0;
#endif
        int remain = w - (nn << 3);

#if __ARM_NEON
        float32x4_t _b0 = vdupq_n_f32(b0);
        float32x4_t _b1 = vdupq_n_f32(b1);
        for (; nn>0; nn--)
        {
            float32x4_t _rows0 = vld1q_f32(rows0p);
            float32x4_t _rows1 = vld1q_f32(rows1p);

            float32x4_t _D = vmulq_f32(_rows0, _b0);
            _D = vmlaq_f32(_D, _rows1, _b1);

            vst1q_f32(Dp, _D);

            float32x4_t _rows0n = vld1q_f32(rows0p+4);
            float32x4_t _rows1n = vld1q_f32(rows1p+4);

            float32x4_t _Dn = vmulq_f32(_rows0n, _b0);
            _Dn = vmlaq_f32(_Dn, _rows1n, _b1);

            vst1q_f32(Dp+4, _Dn);

            Dp += 8;
            rows0p += 8;
            rows1p += 8;
        }
#endif // __ARM_NEON
        for ( ; remain; --remain )
        {
//             D[x] = rows0[x]*b0 + rows1[x]*b1;
            *Dp++ = *rows0p++ * b0 + *rows1p++ * b1;
        }

        beta += 2;
    }

    delete[] buf;
}